

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

EdwardsPoint * eddsa_public(mp_int *private_key,ssh_keyalg *alg)

{
  undefined8 *puVar1;
  BinarySink *bs;
  uint8_t val;
  ec_curve *curve_00;
  ssh_hash *h_00;
  mp_int *n;
  EdwardsPoint *pEVar2;
  ptrlen hash_00;
  EdwardsPoint *toret;
  mp_int *exponent;
  uchar hash [114];
  ulong local_38;
  size_t i;
  ssh_hash *h;
  ec_curve *curve;
  ecsign_extra *extra;
  ssh_keyalg *alg_local;
  mp_int *private_key_local;
  
  puVar1 = (undefined8 *)alg->extra;
  curve_00 = (ec_curve *)(*(code *)*puVar1)();
  if (curve_00->type == EC_EDWARDS) {
    h_00 = ssh_hash_new((ssh_hashalg *)puVar1[1]);
    for (local_38 = 0; local_38 < curve_00->fieldBytes; local_38 = local_38 + 1) {
      bs = h_00->binarysink_;
      val = mp_get_byte(private_key,local_38);
      BinarySink_put_byte(bs,val);
    }
    ssh_hash_final(h_00,(uchar *)&exponent);
    hash_00 = make_ptrlen(&exponent,*(size_t *)(puVar1[1] + 0x28));
    n = eddsa_exponent_from_hash(hash_00,curve_00);
    pEVar2 = ecc_edwards_multiply((curve_00->field_6).e.G,n);
    mp_free(n);
    return pEVar2;
  }
  __assert_fail("curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x179,"EdwardsPoint *eddsa_public(mp_int *, const ssh_keyalg *)");
}

Assistant:

EdwardsPoint *eddsa_public(mp_int *private_key, const ssh_keyalg *alg)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_EDWARDS);

    ssh_hash *h = ssh_hash_new(extra->hash);
    for (size_t i = 0; i < curve->fieldBytes; ++i)
        put_byte(h, mp_get_byte(private_key, i));

    unsigned char hash[MAX_HASH_LEN];
    ssh_hash_final(h, hash);

    mp_int *exponent = eddsa_exponent_from_hash(
        make_ptrlen(hash, extra->hash->hlen), curve);

    EdwardsPoint *toret = ecc_edwards_multiply(curve->e.G, exponent);
    mp_free(exponent);

    return toret;
}